

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O0

ptr<cluster_config> __thiscall raft_functional_common::TestMgr::load_config(TestMgr *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<nuraft::cluster_config> *in_RSI;
  element_type *in_RDI;
  ptr<cluster_config> pVar1;
  
  std::shared_ptr<nuraft::cluster_config>::shared_ptr
            (in_RSI,(shared_ptr<nuraft::cluster_config> *)in_RDI);
  pVar1.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<cluster_config>)
         pVar1.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<cluster_config> load_config() {
        return savedConfig;
    }